

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_inet_pton(int af,char *src,void *dst)

{
  byte bVar1;
  ushort uVar2;
  uint8_t u_1;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  in_addr *addr;
  byte *pbVar12;
  void *__src;
  uint d;
  uint c;
  char more_1;
  uint b;
  char more;
  uint a;
  uint local_74;
  uint local_70;
  undefined1 local_69;
  undefined8 local_68;
  uint local_5c;
  uint local_58 [3];
  ushort local_4c;
  ushort local_4a;
  byte *local_40;
  void *local_38;
  
  if (af != 10) {
    if (af != 2) {
      return -1;
    }
    iVar4 = __isoc99_sscanf(src,"%u.%u.%u.%u%c",local_58,&local_68,&local_70,&local_74,&local_5c);
    if (iVar4 != 4) {
      return 0;
    }
    if (0xff < local_58[0]) {
      return 0;
    }
    if ((uint)local_68 < 0x100) {
      if (0xff < local_70) {
        return 0;
      }
      if (local_74 < 0x100) {
        uVar9 = local_70 << 8 | local_74;
        uVar10 = uVar9 | (uint)local_68 << 0x10 | local_58[0] << 0x18;
        *(uint *)dst = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                       local_74 << 0x18;
        return 1;
      }
      return 0;
    }
    return 0;
  }
  local_40 = (byte *)strchr(src,0x2e);
  if (local_40 != (byte *)src) {
    pbVar11 = local_40;
    local_38 = dst;
    if (local_40 == (byte *)0x0) {
      sVar6 = strlen(src);
      pbVar12 = (byte *)(src + sVar6);
      iVar4 = 0;
    }
    else {
      do {
        pbVar12 = pbVar11;
        pbVar11 = pbVar12 + -1;
        if (pbVar11 < src) break;
      } while ((EVUTIL_ISDIGIT_TABLE[*pbVar11 >> 5] >> (*pbVar11 & 0x1f) & 1) != 0);
      iVar5 = __isoc99_sscanf(pbVar12,"%u.%u.%u.%u%c",&local_68,&local_70,&local_74,&local_5c,
                              &local_69);
      iVar4 = 0;
      bVar3 = false;
      if (iVar5 == 4) {
        iVar4 = 0;
        bVar3 = false;
        if ((local_5c < 0x100 && local_74 < 0x100) && (local_70 < 0x100 && (uint)local_68 < 0x100))
        {
          local_4c = (ushort)((uint)local_68 << 8) | (ushort)local_70;
          local_4a = (ushort)(local_74 << 8) | (ushort)local_5c;
          bVar3 = true;
          iVar4 = 2;
        }
      }
      if (!bVar3) {
        return 0;
      }
    }
    uVar9 = 0xffffffff;
    if (src < pbVar12) {
      uVar9 = 0xffffffff;
      uVar10 = 0;
      do {
        if (7 < (int)uVar10) {
          return 0;
        }
        bVar1 = *src;
        if ((EVUTIL_ISXDIGIT_TABLE[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0) {
          if (((bVar1 == 0x3a) && (0 < (int)uVar10)) && (uVar9 == 0xffffffff)) {
            src = (char *)((byte *)src + 1);
            uVar9 = uVar10;
          }
          else {
            if (bVar1 != 0x3a) {
              return 0;
            }
            if (uVar10 != 0) {
              return 0;
            }
            if (((byte *)src)[1] != 0x3a) {
              return 0;
            }
            if (uVar9 != 0xffffffff) {
              return 0;
            }
            src = (char *)((byte *)src + 2);
            uVar10 = 0;
            uVar9 = 0;
          }
        }
        else {
          uVar7 = strtol(src,(char **)&local_68,0x10);
          pbVar11 = (byte *)CONCAT44(local_68._4_4_,(uint)local_68);
          if ((uVar7 < 0x10001 && pbVar11 != (byte *)src) && pbVar11 <= (byte *)src + 4) {
            lVar8 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            *(short *)((long)local_58 + lVar8 * 2) = (short)uVar7;
            iVar4 = iVar4 + 1;
            bVar3 = pbVar11 == pbVar12 || *pbVar11 == 0x3a;
            src = (char *)(pbVar11 + bVar3);
          }
          else {
            bVar3 = false;
          }
          if (!bVar3) {
            return 0;
          }
        }
      } while (src < pbVar12);
    }
    if ((iVar4 < 9) && ((iVar4 != 8 || (uVar9 == 0xffffffff)))) {
      if ((iVar4 != 8) && (uVar9 == 0xffffffff)) {
        return 0;
      }
      if (-1 < (int)uVar9) {
        iVar5 = ((iVar4 + (uint)(local_40 == (byte *)0x0) * 2) - uVar9) + -2;
        if (iVar5 < 0) {
          return -1;
        }
        __src = (void *)((long)local_58 + (ulong)uVar9 * 2);
        memmove((void *)((long)local_58 + (ulong)(uVar9 + (8U - iVar4)) * 2),__src,
                (ulong)(uint)(iVar5 * 2));
        memset(__src,0,(ulong)(8U - iVar4) * 2);
      }
      lVar8 = 0;
      do {
        uVar2 = *(ushort *)((long)local_58 + lVar8 * 2);
        *(ushort *)((long)local_38 + lVar8 * 2) = uVar2 << 8 | uVar2 >> 8;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      return 1;
    }
  }
  return 0;
}

Assistant:

int
evutil_inet_pton(int af, const char *src, void *dst)
{
#if defined(EVENT__HAVE_INET_PTON) && !defined(USE_INTERNAL_PTON)
	return inet_pton(af, src, dst);
#else
	if (af == AF_INET) {
		unsigned a,b,c,d;
		char more;
		struct in_addr *addr = dst;
		if (sscanf(src, "%u.%u.%u.%u%c", &a,&b,&c,&d,&more) != 4)
			return 0;
		if (a > 255) return 0;
		if (b > 255) return 0;
		if (c > 255) return 0;
		if (d > 255) return 0;
		addr->s_addr = htonl((a<<24) | (b<<16) | (c<<8) | d);
		return 1;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		struct in6_addr *out = dst;
		ev_uint16_t words[8];
		int gapPos = -1, i, setWords=0;
		const char *dot = strchr(src, '.');
		const char *eow; /* end of words. */
		if (dot == src)
			return 0;
		else if (!dot)
			eow = src+strlen(src);
		else {
			unsigned byte1,byte2,byte3,byte4;
			char more;
			for (eow = dot-1; eow >= src && EVUTIL_ISDIGIT_(*eow); --eow)
				;
			++eow;

			/* We use "scanf" because some platform inet_aton()s are too lax
			 * about IPv4 addresses of the form "1.2.3" */
			if (sscanf(eow, "%u.%u.%u.%u%c",
					   &byte1,&byte2,&byte3,&byte4,&more) != 4)
				return 0;

			if (byte1 > 255 ||
			    byte2 > 255 ||
			    byte3 > 255 ||
			    byte4 > 255)
				return 0;

			words[6] = (byte1<<8) | byte2;
			words[7] = (byte3<<8) | byte4;
			setWords += 2;
		}

		i = 0;
		while (src < eow) {
			if (i > 7)
				return 0;
			if (EVUTIL_ISXDIGIT_(*src)) {
				char *next;
				long r = strtol(src, &next, 16);
				if (next > 4+src)
					return 0;
				if (next == src)
					return 0;
				if (r<0 || r>65536)
					return 0;

				words[i++] = (ev_uint16_t)r;
				setWords++;
				src = next;
				if (*src != ':' && src != eow)
					return 0;
				++src;
			} else if (*src == ':' && i > 0 && gapPos==-1) {
				gapPos = i;
				++src;
			} else if (*src == ':' && i == 0 && src[1] == ':' && gapPos==-1) {
				gapPos = i;
				src += 2;
			} else {
				return 0;
			}
		}

		if (setWords > 8 ||
			(setWords == 8 && gapPos != -1) ||
			(setWords < 8 && gapPos == -1))
			return 0;

		if (gapPos >= 0) {
			int nToMove = setWords - (dot ? 2 : 0) - gapPos;
			int gapLen = 8 - setWords;
			/* assert(nToMove >= 0); */
			if (nToMove < 0)
				return -1; /* should be impossible */
			memmove(&words[gapPos+gapLen], &words[gapPos],
					sizeof(ev_uint16_t)*nToMove);
			memset(&words[gapPos], 0, sizeof(ev_uint16_t)*gapLen);
		}
		for (i = 0; i < 8; ++i) {
			out->s6_addr[2*i  ] = words[i] >> 8;
			out->s6_addr[2*i+1] = words[i] & 0xff;
		}

		return 1;
#endif
	} else {
		return -1;
	}
#endif
}